

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

void translate_instruction
               (vector<z80,_std::allocator<z80>_> *instructions,OpCode op,Operand *o1,Operand *o2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  long *plVar7;
  size_type *psVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _Alloc_hider _Var10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  z80 local_1220;
  undefined1 local_1180 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1168;
  string local_1158;
  string local_1138;
  Operand local_1118;
  undefined1 local_10f0 [8];
  _Alloc_hider local_10e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10d8;
  undefined1 local_10c8 [8];
  _Alloc_hider local_10c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10b0;
  string local_10a0;
  string local_1080;
  string local_1060;
  undefined1 local_1040 [8];
  _Alloc_hider local_1038;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1028;
  undefined1 local_1018 [8];
  _Alloc_hider local_1010;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1000;
  undefined1 local_ff0 [8];
  _Alloc_hider local_fe8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fd8;
  undefined1 local_fc8 [8];
  _Alloc_hider local_fc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fb0;
  undefined1 local_fa0 [8];
  _Alloc_hider local_f98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f88;
  undefined1 local_f78 [8];
  _Alloc_hider local_f70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f60;
  undefined1 local_f50 [8];
  _Alloc_hider local_f48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f38;
  undefined1 local_f28 [8];
  _Alloc_hider local_f20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f10;
  undefined1 local_f00 [8];
  _Alloc_hider local_ef8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ee8;
  undefined1 local_ed8 [8];
  _Alloc_hider local_ed0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ec0;
  undefined1 local_eb0 [8];
  _Alloc_hider local_ea8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e98;
  undefined1 local_e88 [8];
  _Alloc_hider local_e80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e70;
  undefined1 local_e60 [8];
  _Alloc_hider local_e58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e48;
  undefined1 local_e38 [8];
  _Alloc_hider local_e30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e20;
  undefined1 local_e10 [8];
  _Alloc_hider local_e08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_df8;
  undefined1 local_de8 [8];
  _Alloc_hider local_de0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_dd0;
  undefined1 local_dc0 [8];
  _Alloc_hider local_db8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_da8;
  undefined1 local_d98 [8];
  _Alloc_hider local_d90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d80;
  undefined1 local_d70 [8];
  _Alloc_hider local_d68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d58;
  undefined1 local_d48 [8];
  _Alloc_hider local_d40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d30;
  undefined1 local_d20 [8];
  _Alloc_hider local_d18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d08;
  undefined1 local_cf8 [8];
  _Alloc_hider local_cf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ce0;
  undefined1 local_cd0 [8];
  _Alloc_hider local_cc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cb8;
  undefined1 local_ca8 [8];
  _Alloc_hider local_ca0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c90;
  undefined1 local_c80 [8];
  _Alloc_hider local_c78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c68;
  undefined1 local_c58 [8];
  _Alloc_hider local_c50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c40;
  undefined1 local_c30 [8];
  _Alloc_hider local_c28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c18;
  undefined1 local_c08 [8];
  _Alloc_hider local_c00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bf0;
  undefined1 local_be0 [8];
  _Alloc_hider local_bd8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bc8;
  undefined1 local_bb8 [8];
  _Alloc_hider local_bb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ba0;
  undefined1 local_b90 [8];
  _Alloc_hider local_b88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b78;
  undefined1 local_b68 [8];
  _Alloc_hider local_b60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b50;
  undefined1 local_b40 [8];
  _Alloc_hider local_b38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b28;
  undefined1 local_b18 [8];
  _Alloc_hider local_b10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b00;
  undefined1 local_af0 [8];
  _Alloc_hider local_ae8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ad8;
  undefined1 local_ac8 [8];
  _Alloc_hider local_ac0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ab0;
  undefined1 local_aa0 [8];
  _Alloc_hider local_a98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a88;
  undefined1 local_a78 [8];
  _Alloc_hider local_a70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a60;
  undefined1 local_a50 [8];
  _Alloc_hider local_a48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a38;
  undefined1 local_a28 [8];
  _Alloc_hider local_a20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a10;
  undefined1 local_a00 [8];
  _Alloc_hider local_9f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9e8;
  undefined1 local_9d8 [8];
  _Alloc_hider local_9d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9c0;
  undefined1 local_9b0 [8];
  _Alloc_hider local_9a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_998;
  undefined1 local_988 [8];
  _Alloc_hider local_980;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_970;
  undefined1 local_960 [8];
  _Alloc_hider local_958;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_948;
  undefined1 local_938 [8];
  _Alloc_hider local_930;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_920;
  undefined1 local_910 [8];
  _Alloc_hider local_908;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8f8;
  undefined1 local_8e8 [8];
  _Alloc_hider local_8e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8d0;
  undefined1 local_8c0 [8];
  _Alloc_hider local_8b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8a8;
  undefined1 local_898 [8];
  _Alloc_hider local_890;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  undefined1 local_870 [8];
  _Alloc_hider local_868;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_858;
  undefined1 local_848 [8];
  _Alloc_hider local_840;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_830;
  undefined1 local_820 [8];
  _Alloc_hider local_818;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_808;
  undefined1 local_7f8 [8];
  _Alloc_hider local_7f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7e0;
  undefined1 local_7d0 [8];
  _Alloc_hider local_7c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b8;
  undefined1 local_7a8 [8];
  _Alloc_hider local_7a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_790;
  undefined1 local_780 [8];
  _Alloc_hider local_778;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_768;
  undefined1 local_758 [8];
  _Alloc_hider local_750;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_740;
  undefined1 local_730 [8];
  _Alloc_hider local_728;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_718;
  undefined1 local_708 [8];
  _Alloc_hider local_700;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f0;
  undefined1 local_6e0 [8];
  _Alloc_hider local_6d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c8;
  undefined1 local_6b8 [8];
  _Alloc_hider local_6b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a0;
  undefined1 local_690 [8];
  _Alloc_hider local_688;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_678;
  Operand local_668;
  Operand local_638;
  Operand local_608;
  Operand local_5d8;
  Operand local_5a8;
  Operand local_578;
  Operand local_548;
  Operand local_518;
  Operand local_4e8;
  Operand local_4b8;
  Operand local_488;
  Operand local_458;
  Operand local_428;
  Operand local_3f8;
  Operand local_3c8;
  Operand local_3a0;
  Operand local_378;
  Operand local_350;
  Operand local_328;
  Operand local_300;
  Operand local_2d8;
  Operand local_2b0;
  Operand local_288;
  Operand local_260;
  Operand local_238;
  Operand local_210;
  Operand local_1e8;
  Operand local_1c0;
  Operand local_198;
  Operand local_170;
  Operand local_148;
  Operand local_120;
  Operand local_f8;
  Operand local_d0;
  Operand local_a8;
  Operand local_80;
  Operand local_58;
  
  switch(op) {
  case hlt:
    local_1220.super_ASMLine.type = 1;
    goto LAB_00118054;
  default:
    local_1220.super_ASMLine._0_8_ = (ulong)(uint)local_1220.super_ASMLine._4_4_ << 0x20;
    goto LAB_00118054;
  case movzwl:
    local_1180._0_4_ = 4;
    local_eb0._0_4_ = o1->type;
    local_eb0._4_4_ = o1->reg_num;
    pcVar4 = (o1->value)._M_dataplus._M_p;
    local_ea8._M_p = (pointer)&local_e98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ea8,pcVar4,pcVar4 + (o1->value)._M_string_length);
    translateLiteral((Operand *)&local_1220,(Operand *)local_eb0);
    std::vector<z80,std::allocator<z80>>::emplace_back<z80::OpCode,Operand&,Operand>
              ((vector<z80,std::allocator<z80>> *)instructions,(OpCode *)local_1180,&registers.iy,
               (Operand *)&local_1220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != &local_1220.super_ASMLine.text.field_2)
    {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    local_fd8._M_allocated_capacity = local_e98._M_allocated_capacity;
    local_58.value._M_dataplus._M_p = local_ea8._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ea8._M_p == &local_e98) {
      return;
    }
    break;
  case xorl:
    local_d98._0_4_ = o2->type;
    local_d98._4_4_ = o2->reg_num;
    pcVar4 = (o2->value)._M_dataplus._M_p;
    local_d90._M_p = (pointer)&local_d80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d90,pcVar4,pcVar4 + (o2->value)._M_string_length);
    translateRegister((Operand *)&local_1220,(Operand *)local_d98);
    bVar5 = Operand::operator==((Operand *)&local_1220,&registers.a);
    paVar9 = &local_1220.super_ASMLine.text.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d90._M_p != &local_d80) {
      operator_delete(local_d90._M_p,local_d80._M_allocated_capacity + 1);
    }
    if (bVar5) {
      local_e60._0_4_ = o2->type;
      local_e60._4_4_ = o2->reg_num;
      pcVar4 = (o2->value)._M_dataplus._M_p;
      local_e58._M_p = (pointer)&local_e48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e58,pcVar4,pcVar4 + (o2->value)._M_string_length);
      translateValue(&local_350,(Operand *)local_e60);
      local_e88._0_4_ = o1->type;
      local_e88._4_4_ = o1->reg_num;
      pcVar4 = (o1->value)._M_dataplus._M_p;
      local_e80._M_p = (pointer)&local_e70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e80,pcVar4,pcVar4 + (o1->value)._M_string_length);
      translateValue(&local_378,(Operand *)local_e88);
      z80::z80(&local_1220,_xor,&local_350,&local_378);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
        operator_delete(local_1220.comment._M_dataplus._M_p,
                        local_1220.comment.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op2.value._M_dataplus._M_p != &local_1220.op2.value.field_2) {
        operator_delete(local_1220.op2.value._M_dataplus._M_p,
                        local_1220.op2.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op1.value._M_dataplus._M_p != &local_1220.op1.value.field_2) {
        operator_delete(local_1220.op1.value._M_dataplus._M_p,
                        local_1220.op1.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.value._M_dataplus._M_p != &local_378.value.field_2) {
        operator_delete(local_378.value._M_dataplus._M_p,
                        local_378.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e80._M_p != &local_e70) {
        operator_delete(local_e80._M_p,local_e70._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350.value._M_dataplus._M_p != &local_350.value.field_2) {
        operator_delete(local_350.value._M_dataplus._M_p,
                        local_350.value.field_2._M_allocated_capacity + 1);
      }
      local_fd8._M_allocated_capacity = local_e48._M_allocated_capacity;
      local_58.value._M_dataplus._M_p = local_e58._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e58._M_p == &local_e48) {
        return;
      }
    }
    else {
      local_dc0._0_4_ = o2->type;
      local_dc0._4_4_ = o2->reg_num;
      pcVar4 = (o2->value)._M_dataplus._M_p;
      local_db8._M_p = (pointer)&local_da8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_db8,pcVar4,pcVar4 + (o2->value)._M_string_length);
      translateRegister((Operand *)&local_1220,(Operand *)local_dc0);
      local_de8._0_4_ = o1->type;
      local_de8._4_4_ = o1->reg_num;
      pcVar4 = (o1->value)._M_dataplus._M_p;
      local_de0._M_p = (pointer)&local_dd0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_de0,pcVar4,pcVar4 + (o1->value)._M_string_length);
      translateRegister((Operand *)local_1180,(Operand *)local_de8);
      bVar5 = Operand::operator==((Operand *)&local_1220,(Operand *)local_1180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1180._8_8_ != &local_1168) {
        operator_delete((void *)local_1180._8_8_,
                        CONCAT71(local_1168._M_allocated_capacity._1_7_,local_1168._M_local_buf[0])
                        + 1);
      }
      paVar9 = &local_1220.super_ASMLine.text.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_de0._M_p != &local_dd0) {
        operator_delete(local_de0._M_p,local_dd0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_db8._M_p != &local_da8) {
        operator_delete(local_db8._M_p,local_da8._M_allocated_capacity + 1);
      }
      if (bVar5) {
        local_e10._0_4_ = o1->type;
        local_e10._4_4_ = o1->reg_num;
        pcVar4 = (o1->value)._M_dataplus._M_p;
        local_e08._M_p = (pointer)&local_df8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e08,pcVar4,pcVar4 + (o1->value)._M_string_length);
        translateRegister(&local_300,(Operand *)local_e10);
        literal(&local_328,0);
        z80::z80(&local_1220,ld,&local_300,&local_328);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
        z80::~z80(&local_1220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328.value._M_dataplus._M_p != &local_328.value.field_2) {
          operator_delete(local_328.value._M_dataplus._M_p,
                          local_328.value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300.value._M_dataplus._M_p != &local_300.value.field_2) {
          operator_delete(local_300.value._M_dataplus._M_p,
                          local_300.value.field_2._M_allocated_capacity + 1);
        }
        local_fd8._M_allocated_capacity = local_df8._M_allocated_capacity;
        local_58.value._M_dataplus._M_p = local_e08._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e08._M_p == &local_df8) {
          return;
        }
      }
      else {
        local_e38._0_4_ = o2->type;
        local_e38._4_4_ = o2->reg_num;
        pcVar4 = (o2->value)._M_dataplus._M_p;
        local_e30._M_p = (pointer)&local_e20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e30,pcVar4,pcVar4 + (o2->value)._M_string_length);
        translateRegister((Operand *)&local_1220,(Operand *)local_e38);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1180,"Attempt to xor a register other than a!",
                       &local_1220.super_ASMLine.text);
        log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        if ((undefined1 *)CONCAT44(local_1180._4_4_,local_1180._0_4_) != local_1180 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_1180._4_4_,local_1180._0_4_),
                          local_1180._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
          operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                          CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_
                                   ,local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
        }
        local_fd8._M_allocated_capacity = local_e20._M_allocated_capacity;
        local_58.value._M_dataplus._M_p = local_e30._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e30._M_p == &local_e20) {
          return;
        }
      }
    }
    break;
  case ret:
  case retl:
    local_1220.super_ASMLine.type = 2;
LAB_00118054:
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80::OpCode>
              (instructions,(OpCode *)&local_1220);
    return;
  case movb:
  case movl:
    local_1080._M_dataplus._M_p = (pointer)&local_1080.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1080,"(%esp)","");
    literal((Operand *)&local_1220,&local_1080);
    bVar5 = Operand::operator==(o2,(Operand *)&local_1220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != &local_1220.super_ASMLine.text.field_2)
    {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1080._M_dataplus._M_p != &local_1080.field_2) {
      operator_delete(local_1080._M_dataplus._M_p,local_1080.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) {
      local_1180._0_4_ = 4;
      local_f28._0_4_ = o1->type;
      local_f28._4_4_ = o1->reg_num;
      pcVar4 = (o1->value)._M_dataplus._M_p;
      local_f20._M_p = (pointer)&local_f10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f20,pcVar4,pcVar4 + (o1->value)._M_string_length);
      translateValue((Operand *)&local_1220,(Operand *)local_f28);
      paVar9 = &local_1220.super_ASMLine.text.field_2;
      std::vector<z80,std::allocator<z80>>::emplace_back<z80::OpCode,Operand&,Operand>
                ((vector<z80,std::allocator<z80>> *)instructions,(OpCode *)local_1180,&registers.iyl
                 ,(Operand *)&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f20._M_p != &local_f10) {
        operator_delete(local_f20._M_p,local_f10._M_allocated_capacity + 1);
      }
      local_1180._0_4_ = 4;
      literal((Operand *)&local_1220,0);
      std::vector<z80,std::allocator<z80>>::emplace_back<z80::OpCode,Operand&,Operand>
                ((vector<z80,std::allocator<z80>> *)instructions,(OpCode *)local_1180,&registers.iyh
                 ,(Operand *)&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      local_1180._0_4_ = 7;
      local_10a0._M_dataplus._M_p = (pointer)&local_10a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_10a0,"(sp)","");
      literal((Operand *)&local_1220,&local_10a0);
      std::vector<z80,std::allocator<z80>>::emplace_back<z80::OpCode,Operand,Operand&>
                ((vector<z80,std::allocator<z80>> *)instructions,(OpCode *)local_1180,
                 (Operand *)&local_1220,&registers.iy);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      local_fd8._M_allocated_capacity = local_10a0.field_2._M_allocated_capacity;
      local_58.value._M_dataplus._M_p = local_10a0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10a0._M_dataplus._M_p == &local_10a0.field_2) {
        return;
      }
    }
    else {
      local_1220.super_ASMLine.type = Directive;
      local_1220.super_ASMLine._4_4_ = 0x10;
      paVar9 = &local_1220.super_ASMLine.text.field_2;
      local_1220.super_ASMLine.text._M_string_length = 0;
      local_1220.super_ASMLine.text.field_2._M_local_buf[0] = '\0';
      local_1220.super_ASMLine.text._M_dataplus._M_p = (pointer)paVar9;
      bVar5 = Operand::operator==(o1,(Operand *)&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar5) {
        local_f50._0_4_ = registers.a.type;
        local_f50._4_4_ = registers.a.reg_num;
        local_f48._M_p = (pointer)&local_f38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f48,registers.a.value._M_dataplus._M_p,
                   registers.a.value._M_dataplus._M_p + registers.a.value._M_string_length);
        local_f78._0_4_ = o1->type;
        local_f78._4_4_ = o1->reg_num;
        pcVar4 = (o1->value)._M_dataplus._M_p;
        local_f70._M_p = (pointer)&local_f60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f70,pcVar4,pcVar4 + (o1->value)._M_string_length);
        translateLiteral(&local_3a0,(Operand *)local_f78);
        z80::z80(&local_1220,ld,(Operand *)local_f50,&local_3a0);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
          operator_delete(local_1220.comment._M_dataplus._M_p,
                          local_1220.comment.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1220.op2.value._M_dataplus._M_p != &local_1220.op2.value.field_2) {
          operator_delete(local_1220.op2.value._M_dataplus._M_p,
                          local_1220.op2.value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1220.op1.value._M_dataplus._M_p != &local_1220.op1.value.field_2) {
          operator_delete(local_1220.op1.value._M_dataplus._M_p,
                          local_1220.op1.value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1220.super_ASMLine.text._M_dataplus._M_p !=
            &local_1220.super_ASMLine.text.field_2) {
          operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                          CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_
                                   ,local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0.value._M_dataplus._M_p != &local_3a0.value.field_2) {
          operator_delete(local_3a0.value._M_dataplus._M_p,
                          local_3a0.value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f70._M_p != &local_f60) {
          operator_delete(local_f70._M_p,local_f60._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f48._M_p != &local_f38) {
          operator_delete(local_f48._M_p,local_f38._M_allocated_capacity + 1);
        }
      }
      paVar9 = &local_1220.super_ASMLine.text.field_2;
      local_1220.super_ASMLine.type = Directive;
      local_1220.super_ASMLine._4_4_ = 0x10;
      local_1220.super_ASMLine.text._M_string_length = 0;
      local_1220.super_ASMLine.text.field_2._M_local_buf[0] = '\0';
      local_1220.super_ASMLine.text._M_dataplus._M_p = (pointer)paVar9;
      bVar5 = Operand::operator==(o2,(Operand *)&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if (bVar5) {
        return;
      }
      local_fa0._0_4_ = o2->type;
      local_fa0._4_4_ = o2->reg_num;
      pcVar4 = (o2->value)._M_dataplus._M_p;
      local_f98._M_p = (pointer)&local_f88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f98,pcVar4,pcVar4 + (o2->value)._M_string_length);
      translateAddress(&local_3c8,(Operand *)local_fa0);
      local_fc8._0_4_ = registers.a.type;
      local_fc8._4_4_ = registers.a.reg_num;
      local_fc0._M_p = (pointer)&local_fb0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_fc0,registers.a.value._M_dataplus._M_p,
                 registers.a.value._M_dataplus._M_p + registers.a.value._M_string_length);
      z80::z80(&local_1220,ld,&local_3c8,(Operand *)local_fc8);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
        operator_delete(local_1220.comment._M_dataplus._M_p,
                        local_1220.comment.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op2.value._M_dataplus._M_p != &local_1220.op2.value.field_2) {
        operator_delete(local_1220.op2.value._M_dataplus._M_p,
                        local_1220.op2.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op1.value._M_dataplus._M_p != &local_1220.op1.value.field_2) {
        operator_delete(local_1220.op1.value._M_dataplus._M_p,
                        local_1220.op1.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_fc0._M_p != &local_fb0) {
        operator_delete(local_fc0._M_p,local_fb0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.value._M_dataplus._M_p != &local_3c8.value.field_2) {
        operator_delete(local_3c8.value._M_dataplus._M_p,
                        local_3c8.value.field_2._M_allocated_capacity + 1);
      }
      local_fd8._M_allocated_capacity = local_f88._M_allocated_capacity;
      local_58.value._M_dataplus._M_p = local_f98._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f98._M_p == &local_f88) {
        return;
      }
    }
    break;
  case movw:
    local_1118.type = 4;
    local_ed8._0_4_ = o2->type;
    local_ed8._4_4_ = o2->reg_num;
    pcVar4 = (o2->value)._M_dataplus._M_p;
    local_ed0._M_p = (pointer)&local_ec0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ed0,pcVar4,pcVar4 + (o2->value)._M_string_length);
    translateAddress((Operand *)&local_1220,(Operand *)local_ed8);
    local_f00._0_4_ = o1->type;
    local_f00._4_4_ = o1->reg_num;
    pcVar4 = (o1->value)._M_dataplus._M_p;
    local_ef8._M_p = (pointer)&local_ee8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ef8,pcVar4,pcVar4 + (o1->value)._M_string_length);
    translateValue((Operand *)local_1180,(Operand *)local_f00);
    std::vector<z80,std::allocator<z80>>::emplace_back<z80::OpCode,Operand,Operand>
              ((vector<z80,std::allocator<z80>> *)instructions,&local_1118.type,
               (Operand *)&local_1220,(Operand *)local_1180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1180._8_8_ != &local_1168) {
      operator_delete((void *)local_1180._8_8_,
                      CONCAT71(local_1168._M_allocated_capacity._1_7_,local_1168._M_local_buf[0]) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ef8._M_p != &local_ee8) {
      operator_delete(local_ef8._M_p,local_ee8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != &local_1220.super_ASMLine.text.field_2)
    {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    local_fd8._M_allocated_capacity = local_ec0._M_allocated_capacity;
    local_58.value._M_dataplus._M_p = local_ed0._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ed0._M_p == &local_ec0) {
      return;
    }
    break;
  case jne:
    local_1060._M_dataplus._M_p = (pointer)&local_1060.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1060,"nz","");
    literal(&local_1c0,&local_1060);
    local_ac8._0_4_ = o1->type;
    local_ac8._4_4_ = o1->reg_num;
    pcVar4 = (o1->value)._M_dataplus._M_p;
    local_ac0._M_p = (pointer)&local_ab0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ac0,pcVar4,pcVar4 + (o1->value)._M_string_length);
    translateLiteral(&local_1e8,(Operand *)local_ac8);
    z80::z80(&local_1220,jp,&local_1c0,&local_1e8);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
      operator_delete(local_1220.comment._M_dataplus._M_p,
                      local_1220.comment.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op2.value._M_dataplus._M_p != &local_1220.op2.value.field_2) {
      operator_delete(local_1220.op2.value._M_dataplus._M_p,
                      local_1220.op2.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op1.value._M_dataplus._M_p != &local_1220.op1.value.field_2) {
      operator_delete(local_1220.op1.value._M_dataplus._M_p,
                      local_1220.op1.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != &local_1220.super_ASMLine.text.field_2)
    {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.value._M_dataplus._M_p != &local_1e8.value.field_2) {
      operator_delete(local_1e8.value._M_dataplus._M_p,
                      local_1e8.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ac0._M_p != &local_ab0) {
      operator_delete(local_ac0._M_p,local_ab0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0.value._M_dataplus._M_p != &local_1c0.value.field_2) {
      operator_delete(local_1c0.value._M_dataplus._M_p,
                      local_1c0.value.field_2._M_allocated_capacity + 1);
    }
    local_fd8._M_allocated_capacity = local_1060.field_2._M_allocated_capacity;
    local_58.value._M_dataplus._M_p = local_1060._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1060._M_dataplus._M_p == &local_1060.field_2) {
      return;
    }
    break;
  case incl:
    local_aa0._0_4_ = o1->type;
    local_aa0._4_4_ = o1->reg_num;
    pcVar4 = (o1->value)._M_dataplus._M_p;
    local_a98._M_p = (pointer)&local_a88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a98,pcVar4,pcVar4 + (o1->value)._M_string_length);
    translateValue(&local_198,(Operand *)local_aa0);
    paVar9 = &local_638.value.field_2;
    local_638.type = empty;
    local_638.reg_num = 0;
    local_638.value._M_string_length = 0;
    local_638.value.field_2._8_8_ = 0;
    local_638.value.field_2._M_allocated_capacity = 0;
    local_638.value._M_dataplus._M_p = (pointer)paVar9;
    z80::z80(&local_1220,inc,&local_198,&local_638);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
      operator_delete(local_1220.comment._M_dataplus._M_p,
                      local_1220.comment.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_1220.op2.value.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op2.value._M_dataplus._M_p != paVar3) {
      operator_delete(local_1220.op2.value._M_dataplus._M_p,
                      local_1220.op2.value.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_1220.op1.value.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op1.value._M_dataplus._M_p != paVar1) {
      operator_delete(local_1220.op1.value._M_dataplus._M_p,
                      local_1220.op1.value.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_1220.super_ASMLine.text.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar2) {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638.value._M_dataplus._M_p != paVar9) {
      operator_delete(local_638.value._M_dataplus._M_p,
                      local_638.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198.value._M_dataplus._M_p != &local_198.value.field_2) {
      operator_delete(local_198.value._M_dataplus._M_p,
                      local_198.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a98._M_p != &local_a88) {
      operator_delete(local_a98._M_p,local_a88._M_allocated_capacity + 1);
    }
    literal(&local_80,0);
    paVar9 = &local_668.value.field_2;
    local_668.type = empty;
    local_668.reg_num = 0;
    local_668.value._M_string_length = 0;
    local_668.value.field_2._8_8_ = 0;
    local_668.value.field_2._M_allocated_capacity = 0;
    local_668.value._M_dataplus._M_p = (pointer)paVar9;
    z80::z80(&local_1220,cp,&local_80,&local_668);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
      operator_delete(local_1220.comment._M_dataplus._M_p,
                      local_1220.comment.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op2.value._M_dataplus._M_p != paVar3) {
      operator_delete(local_1220.op2.value._M_dataplus._M_p,
                      local_1220.op2.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op1.value._M_dataplus._M_p != paVar1) {
      operator_delete(local_1220.op1.value._M_dataplus._M_p,
                      local_1220.op1.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar2) {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_668.value._M_dataplus._M_p != paVar9) {
      operator_delete(local_668.value._M_dataplus._M_p,
                      local_668.value.field_2._M_allocated_capacity + 1);
    }
    local_fd8._M_allocated_capacity = local_80.value.field_2._M_allocated_capacity;
    local_58.value._M_dataplus._M_p = local_80.value._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.value._M_dataplus._M_p == &local_80.value.field_2) {
      return;
    }
    break;
  case decl:
    local_a78._0_4_ = o1->type;
    local_a78._4_4_ = o1->reg_num;
    pcVar4 = (o1->value)._M_dataplus._M_p;
    local_a70._M_p = (pointer)&local_a60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a70,pcVar4,pcVar4 + (o1->value)._M_string_length);
    translateValue(&local_170,(Operand *)local_a78);
    paVar9 = &local_5d8.value.field_2;
    local_5d8.type = empty;
    local_5d8.reg_num = 0;
    local_5d8.value._M_string_length = 0;
    local_5d8.value.field_2._8_8_ = 0;
    local_5d8.value.field_2._M_allocated_capacity = 0;
    local_5d8.value._M_dataplus._M_p = (pointer)paVar9;
    z80::z80(&local_1220,dec,&local_170,&local_5d8);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
      operator_delete(local_1220.comment._M_dataplus._M_p,
                      local_1220.comment.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_1220.op2.value.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op2.value._M_dataplus._M_p != paVar3) {
      operator_delete(local_1220.op2.value._M_dataplus._M_p,
                      local_1220.op2.value.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_1220.op1.value.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op1.value._M_dataplus._M_p != paVar1) {
      operator_delete(local_1220.op1.value._M_dataplus._M_p,
                      local_1220.op1.value.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_1220.super_ASMLine.text.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar2) {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8.value._M_dataplus._M_p != paVar9) {
      operator_delete(local_5d8.value._M_dataplus._M_p,
                      local_5d8.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.value._M_dataplus._M_p != &local_170.value.field_2) {
      operator_delete(local_170.value._M_dataplus._M_p,
                      local_170.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a70._M_p != &local_a60) {
      operator_delete(local_a70._M_p,local_a60._M_allocated_capacity + 1);
    }
    literal(&local_58,0);
    paVar9 = &local_608.value.field_2;
    local_608.type = empty;
    local_608.reg_num = 0;
    local_608.value._M_string_length = 0;
    local_608.value.field_2._8_8_ = 0;
    local_608.value.field_2._M_allocated_capacity = 0;
    local_608.value._M_dataplus._M_p = (pointer)paVar9;
    z80::z80(&local_1220,cp,&local_58,&local_608);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
      operator_delete(local_1220.comment._M_dataplus._M_p,
                      local_1220.comment.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op2.value._M_dataplus._M_p != paVar3) {
      operator_delete(local_1220.op2.value._M_dataplus._M_p,
                      local_1220.op2.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op1.value._M_dataplus._M_p != paVar1) {
      operator_delete(local_1220.op1.value._M_dataplus._M_p,
                      local_1220.op1.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar2) {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608.value._M_dataplus._M_p != paVar9) {
      operator_delete(local_608.value._M_dataplus._M_p,
                      local_608.value.field_2._M_allocated_capacity + 1);
    }
    local_fd8._M_allocated_capacity = local_58.value.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.value._M_dataplus._M_p == &local_58.value.field_2) {
      return;
    }
    break;
  case addl:
    local_c58._0_4_ = o2->type;
    local_c58._4_4_ = o2->reg_num;
    pcVar4 = (o2->value)._M_dataplus._M_p;
    local_c50._M_p = (pointer)&local_c40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c50,pcVar4,pcVar4 + (o2->value)._M_string_length);
    translateValue((Operand *)&local_1220,(Operand *)local_c58);
    bVar5 = Operand::operator==((Operand *)&local_1220,&registers.sp);
    paVar9 = &local_1220.super_ASMLine.text.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c50._M_p != &local_c40) {
      operator_delete(local_c50._M_p,local_c40._M_allocated_capacity + 1);
    }
    if (bVar5) {
      local_1040._0_4_ = registers.ix.type;
      local_1040._4_4_ = registers.ix.reg_num;
      local_1038._M_p = (pointer)&local_1028;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1038,registers.ix.value._M_dataplus._M_p,
                 registers.ix.value._M_dataplus._M_p + registers.ix.value._M_string_length);
      local_c80._0_4_ = o1->type;
      local_c80._4_4_ = o1->reg_num;
      pcVar4 = (o1->value)._M_dataplus._M_p;
      local_c78._M_p = (pointer)&local_c68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c78,pcVar4,pcVar4 + (o1->value)._M_string_length);
      translateLiteral((Operand *)local_1180,(Operand *)local_c80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1180._8_8_ == &local_1168) {
        local_1158.field_2._8_8_ = local_1168._8_8_;
        local_1158._M_dataplus._M_p = (pointer)&local_1158.field_2;
      }
      else {
        local_1158._M_dataplus._M_p = (pointer)local_1180._8_8_;
      }
      local_1158.field_2._M_allocated_capacity._1_7_ = local_1168._M_allocated_capacity._1_7_;
      local_1158.field_2._M_local_buf[0] = local_1168._M_local_buf[0];
      local_1158._M_string_length = local_1180._16_8_;
      local_1180._16_8_ = 0;
      local_1168._M_local_buf[0] = '\0';
      local_1180._8_8_ = &local_1168;
      literal(&local_288,&local_1158);
      z80::z80(&local_1220,ld,(Operand *)local_1040,&local_288);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
        operator_delete(local_1220.comment._M_dataplus._M_p,
                        local_1220.comment.field_2._M_allocated_capacity + 1);
      }
      paVar9 = &local_1220.op2.value.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op2.value._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.op2.value._M_dataplus._M_p,
                        local_1220.op2.value.field_2._M_allocated_capacity + 1);
      }
      paVar3 = &local_1220.op1.value.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op1.value._M_dataplus._M_p != paVar3) {
        operator_delete(local_1220.op1.value._M_dataplus._M_p,
                        local_1220.op1.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p !=
          &local_1220.super_ASMLine.text.field_2) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288.value._M_dataplus._M_p != &local_288.value.field_2) {
        operator_delete(local_288.value._M_dataplus._M_p,
                        local_288.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1158._M_dataplus._M_p != &local_1158.field_2) {
        operator_delete(local_1158._M_dataplus._M_p,local_1158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1180._8_8_ != &local_1168) {
        operator_delete((void *)local_1180._8_8_,
                        CONCAT71(local_1168._M_allocated_capacity._1_7_,local_1168._M_local_buf[0])
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c78._M_p != &local_c68) {
        operator_delete(local_c78._M_p,local_c68._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1038._M_p != &local_1028) {
        operator_delete(local_1038._M_p,local_1028._M_allocated_capacity + 1);
      }
      local_ca8._0_4_ = registers.ix.type;
      local_ca8._4_4_ = registers.ix.reg_num;
      local_ca0._M_p = (pointer)&local_c90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_ca0,registers.ix.value._M_dataplus._M_p,
                 registers.ix.value._M_dataplus._M_p + registers.ix.value._M_string_length);
      local_cd0._0_4_ = registers.sp.type;
      local_cd0._4_4_ = registers.sp.reg_num;
      local_cc8._M_p = (pointer)&local_cb8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_cc8,registers.sp.value._M_dataplus._M_p,
                 registers.sp.value._M_dataplus._M_p + registers.sp.value._M_string_length);
      paVar1 = &local_1220.comment.field_2;
      z80::z80(&local_1220,add,(Operand *)local_ca8,(Operand *)local_cd0);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.comment._M_dataplus._M_p != paVar1) {
        operator_delete(local_1220.comment._M_dataplus._M_p,
                        local_1220.comment.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op2.value._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.op2.value._M_dataplus._M_p,
                        local_1220.op2.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op1.value._M_dataplus._M_p != paVar3) {
        operator_delete(local_1220.op1.value._M_dataplus._M_p,
                        local_1220.op1.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p !=
          &local_1220.super_ASMLine.text.field_2) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cc8._M_p != &local_cb8) {
        operator_delete(local_cc8._M_p,local_cb8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ca0._M_p != &local_c90) {
        operator_delete(local_ca0._M_p,local_c90._M_allocated_capacity + 1);
      }
      local_cf8._0_4_ = registers.sp.type;
      local_cf8._4_4_ = registers.sp.reg_num;
      local_cf0._M_p = (pointer)&local_ce0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_cf0,registers.sp.value._M_dataplus._M_p,
                 registers.sp.value._M_dataplus._M_p + registers.sp.value._M_string_length);
      local_d20._0_4_ = registers.ix.type;
      local_d20._4_4_ = registers.ix.reg_num;
      local_d18._M_p = (pointer)&local_d08;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d18,registers.ix.value._M_dataplus._M_p,
                 registers.ix.value._M_dataplus._M_p + registers.ix.value._M_string_length);
      z80::z80(&local_1220,ld,(Operand *)local_cf8,(Operand *)local_d20);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.comment._M_dataplus._M_p != paVar1) {
        operator_delete(local_1220.comment._M_dataplus._M_p,
                        local_1220.comment.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op2.value._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.op2.value._M_dataplus._M_p,
                        local_1220.op2.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op1.value._M_dataplus._M_p != paVar3) {
        operator_delete(local_1220.op1.value._M_dataplus._M_p,
                        local_1220.op1.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p !=
          &local_1220.super_ASMLine.text.field_2) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d18._M_p != &local_d08) {
        operator_delete(local_d18._M_p,local_d08._M_allocated_capacity + 1);
      }
      local_fd8._M_allocated_capacity = local_ce0._M_allocated_capacity;
      local_58.value._M_dataplus._M_p = local_cf0._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cf0._M_p == &local_ce0) {
        return;
      }
    }
    else {
      local_d48._0_4_ = o2->type;
      local_d48._4_4_ = o2->reg_num;
      pcVar4 = (o2->value)._M_dataplus._M_p;
      local_d40._M_p = (pointer)&local_d30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d40,pcVar4,pcVar4 + (o2->value)._M_string_length);
      translateValue(&local_2b0,(Operand *)local_d48);
      local_d70._0_4_ = o1->type;
      local_d70._4_4_ = o1->reg_num;
      pcVar4 = (o1->value)._M_dataplus._M_p;
      local_d68._M_p = (pointer)&local_d58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d68,pcVar4,pcVar4 + (o1->value)._M_string_length);
      translateLiteral(&local_2d8,(Operand *)local_d70);
      z80::z80(&local_1220,add,&local_2b0,&local_2d8);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
        operator_delete(local_1220.comment._M_dataplus._M_p,
                        local_1220.comment.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op2.value._M_dataplus._M_p != &local_1220.op2.value.field_2) {
        operator_delete(local_1220.op2.value._M_dataplus._M_p,
                        local_1220.op2.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op1.value._M_dataplus._M_p != &local_1220.op1.value.field_2) {
        operator_delete(local_1220.op1.value._M_dataplus._M_p,
                        local_1220.op1.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.value._M_dataplus._M_p != &local_2d8.value.field_2) {
        operator_delete(local_2d8.value._M_dataplus._M_p,
                        local_2d8.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d68._M_p != &local_d58) {
        operator_delete(local_d68._M_p,local_d58._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0.value._M_dataplus._M_p != &local_2b0.value.field_2) {
        operator_delete(local_2b0.value._M_dataplus._M_p,
                        local_2b0.value.field_2._M_allocated_capacity + 1);
      }
      local_fd8._M_allocated_capacity = local_d30._M_allocated_capacity;
      local_58.value._M_dataplus._M_p = local_d40._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d40._M_p == &local_d30) {
        return;
      }
    }
    break;
  case subl:
    local_af0._0_4_ = o2->type;
    local_af0._4_4_ = o2->reg_num;
    pcVar4 = (o2->value)._M_dataplus._M_p;
    local_ae8._M_p = (pointer)&local_ad8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ae8,pcVar4,pcVar4 + (o2->value)._M_string_length);
    translateValue((Operand *)&local_1220,(Operand *)local_af0);
    bVar5 = Operand::operator==((Operand *)&local_1220,&registers.sp);
    paVar9 = &local_1220.super_ASMLine.text.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ae8._M_p != &local_ad8) {
      operator_delete(local_ae8._M_p,local_ad8._M_allocated_capacity + 1);
    }
    if (bVar5) {
      local_b18._0_4_ = registers.ix.type;
      local_b18._4_4_ = registers.ix.reg_num;
      local_b10._M_p = (pointer)&local_b00;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b10,registers.ix.value._M_dataplus._M_p,
                 registers.ix.value._M_dataplus._M_p + registers.ix.value._M_string_length);
      local_b40._0_4_ = o1->type;
      local_b40._4_4_ = o1->reg_num;
      pcVar4 = (o1->value)._M_dataplus._M_p;
      local_b38._M_p = (pointer)&local_b28;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b38,pcVar4,pcVar4 + (o1->value)._M_string_length);
      translateLiteral((Operand *)local_1180,(Operand *)local_b40);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)(local_1180 + 8),0,(char *)0x0,0x11f3bb)
      ;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_1138.field_2._M_allocated_capacity = *psVar8;
        local_1138.field_2._8_8_ = plVar7[3];
        local_1138._M_dataplus._M_p = (pointer)&local_1138.field_2;
      }
      else {
        local_1138.field_2._M_allocated_capacity = *psVar8;
        local_1138._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_1138._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      literal(&local_210,&local_1138);
      z80::z80(&local_1220,ld,(Operand *)local_b18,&local_210);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
        operator_delete(local_1220.comment._M_dataplus._M_p,
                        local_1220.comment.field_2._M_allocated_capacity + 1);
      }
      paVar3 = &local_1220.op2.value.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op2.value._M_dataplus._M_p != paVar3) {
        operator_delete(local_1220.op2.value._M_dataplus._M_p,
                        local_1220.op2.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op1.value._M_dataplus._M_p != &local_1220.op1.value.field_2) {
        operator_delete(local_1220.op1.value._M_dataplus._M_p,
                        local_1220.op1.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210.value._M_dataplus._M_p != &local_210.value.field_2) {
        operator_delete(local_210.value._M_dataplus._M_p,
                        local_210.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1138._M_dataplus._M_p != &local_1138.field_2) {
        operator_delete(local_1138._M_dataplus._M_p,local_1138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1180._8_8_ != &local_1168) {
        operator_delete((void *)local_1180._8_8_,
                        CONCAT71(local_1168._M_allocated_capacity._1_7_,local_1168._M_local_buf[0])
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b38._M_p != &local_b28) {
        operator_delete(local_b38._M_p,local_b28._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b10._M_p != &local_b00) {
        operator_delete(local_b10._M_p,local_b00._M_allocated_capacity + 1);
      }
      local_b68._0_4_ = registers.ix.type;
      local_b68._4_4_ = registers.ix.reg_num;
      local_b60._M_p = (pointer)&local_b50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b60,registers.ix.value._M_dataplus._M_p,
                 registers.ix.value._M_dataplus._M_p + registers.ix.value._M_string_length);
      local_b90._0_4_ = registers.sp.type;
      local_b90._4_4_ = registers.sp.reg_num;
      local_b88._M_p = (pointer)&local_b78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b88,registers.sp.value._M_dataplus._M_p,
                 registers.sp.value._M_dataplus._M_p + registers.sp.value._M_string_length);
      paVar1 = &local_1220.comment.field_2;
      paVar9 = &local_1220.op1.value.field_2;
      z80::z80(&local_1220,add,(Operand *)local_b68,(Operand *)local_b90);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.comment._M_dataplus._M_p != paVar1) {
        operator_delete(local_1220.comment._M_dataplus._M_p,
                        local_1220.comment.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op2.value._M_dataplus._M_p != paVar3) {
        operator_delete(local_1220.op2.value._M_dataplus._M_p,
                        local_1220.op2.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op1.value._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.op1.value._M_dataplus._M_p,
                        local_1220.op1.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p !=
          &local_1220.super_ASMLine.text.field_2) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b88._M_p != &local_b78) {
        operator_delete(local_b88._M_p,local_b78._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b60._M_p != &local_b50) {
        operator_delete(local_b60._M_p,local_b50._M_allocated_capacity + 1);
      }
      local_bb8._0_4_ = registers.sp.type;
      local_bb8._4_4_ = registers.sp.reg_num;
      local_bb0._M_p = (pointer)&local_ba0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_bb0,registers.sp.value._M_dataplus._M_p,
                 registers.sp.value._M_dataplus._M_p + registers.sp.value._M_string_length);
      local_be0._0_4_ = registers.ix.type;
      local_be0._4_4_ = registers.ix.reg_num;
      local_bd8._M_p = (pointer)&local_bc8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_bd8,registers.ix.value._M_dataplus._M_p,
                 registers.ix.value._M_dataplus._M_p + registers.ix.value._M_string_length);
      z80::z80(&local_1220,ld,(Operand *)local_bb8,(Operand *)local_be0);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.comment._M_dataplus._M_p != paVar1) {
        operator_delete(local_1220.comment._M_dataplus._M_p,
                        local_1220.comment.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op2.value._M_dataplus._M_p != paVar3) {
        operator_delete(local_1220.op2.value._M_dataplus._M_p,
                        local_1220.op2.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op1.value._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.op1.value._M_dataplus._M_p,
                        local_1220.op1.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p !=
          &local_1220.super_ASMLine.text.field_2) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd8._M_p != &local_bc8) {
        operator_delete(local_bd8._M_p,local_bc8._M_allocated_capacity + 1);
      }
      local_fd8._M_allocated_capacity = local_ba0._M_allocated_capacity;
      local_58.value._M_dataplus._M_p = local_bb0._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bb0._M_p == &local_ba0) {
        return;
      }
    }
    else {
      local_c08._0_4_ = o2->type;
      local_c08._4_4_ = o2->reg_num;
      pcVar4 = (o2->value)._M_dataplus._M_p;
      local_c00._M_p = (pointer)&local_bf0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c00,pcVar4,pcVar4 + (o2->value)._M_string_length);
      translateValue(&local_238,(Operand *)local_c08);
      local_c30._0_4_ = o1->type;
      local_c30._4_4_ = o1->reg_num;
      pcVar4 = (o1->value)._M_dataplus._M_p;
      local_c28._M_p = (pointer)&local_c18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c28,pcVar4,pcVar4 + (o1->value)._M_string_length);
      translateLiteral(&local_260,(Operand *)local_c30);
      z80::z80(&local_1220,sub,&local_238,&local_260);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
        operator_delete(local_1220.comment._M_dataplus._M_p,
                        local_1220.comment.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op2.value._M_dataplus._M_p != &local_1220.op2.value.field_2) {
        operator_delete(local_1220.op2.value._M_dataplus._M_p,
                        local_1220.op2.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op1.value._M_dataplus._M_p != &local_1220.op1.value.field_2) {
        operator_delete(local_1220.op1.value._M_dataplus._M_p,
                        local_1220.op1.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.value._M_dataplus._M_p != &local_260.value.field_2) {
        operator_delete(local_260.value._M_dataplus._M_p,
                        local_260.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c28._M_p != &local_c18) {
        operator_delete(local_c28._M_p,local_c18._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.value._M_dataplus._M_p != &local_238.value.field_2) {
        operator_delete(local_238.value._M_dataplus._M_p,
                        local_238.value.field_2._M_allocated_capacity + 1);
      }
      local_fd8._M_allocated_capacity = local_bf0._M_allocated_capacity;
      local_58.value._M_dataplus._M_p = local_c00._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c00._M_p == &local_bf0) {
        return;
      }
    }
    break;
  case pushl:
    local_690._0_4_ = o1->type;
    local_690._4_4_ = o1->reg_num;
    pcVar4 = (o1->value)._M_dataplus._M_p;
    local_688._M_p = (pointer)&local_678;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_688,pcVar4,pcVar4 + (o1->value)._M_string_length);
    translateValue((Operand *)&local_1220,(Operand *)local_690);
    bVar5 = Operand::operator==((Operand *)&local_1220,&registers.a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != &local_1220.super_ASMLine.text.field_2)
    {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_688._M_p != &local_678) {
      operator_delete(local_688._M_p,local_678._M_allocated_capacity + 1);
    }
    if (bVar5) {
      local_6b8._0_4_ = registers.iyh.type;
      local_6b8._4_4_ = registers.iyh.reg_num;
      local_6b0._M_p = (pointer)&local_6a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6b0,registers.iyh.value._M_dataplus._M_p,
                 registers.iyh.value._M_dataplus._M_p + registers.iyh.value._M_string_length);
      local_6e0._0_4_ = registers.a.type;
      local_6e0._4_4_ = registers.a.reg_num;
      local_6d8._M_p = (pointer)&local_6c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6d8,registers.a.value._M_dataplus._M_p,
                 registers.a.value._M_dataplus._M_p + registers.a.value._M_string_length);
      z80::z80(&local_1220,ld,(Operand *)local_6b8,(Operand *)local_6e0);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
      paVar9 = &local_1220.comment.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.comment._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.comment._M_dataplus._M_p,
                        local_1220.comment.field_2._M_allocated_capacity + 1);
      }
      paVar3 = &local_1220.op2.value.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op2.value._M_dataplus._M_p != paVar3) {
        operator_delete(local_1220.op2.value._M_dataplus._M_p,
                        local_1220.op2.value.field_2._M_allocated_capacity + 1);
      }
      paVar1 = &local_1220.op1.value.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op1.value._M_dataplus._M_p != paVar1) {
        operator_delete(local_1220.op1.value._M_dataplus._M_p,
                        local_1220.op1.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p !=
          &local_1220.super_ASMLine.text.field_2) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_p != &local_6c8) {
        operator_delete(local_6d8._M_p,local_6c8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b0._M_p != &local_6a0) {
        operator_delete(local_6b0._M_p,local_6a0._M_allocated_capacity + 1);
      }
      local_708._0_4_ = registers.iyl.type;
      local_708._4_4_ = registers.iyl.reg_num;
      local_700._M_p = (pointer)&local_6f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_700,registers.iyl.value._M_dataplus._M_p,
                 registers.iyl.value._M_dataplus._M_p + registers.iyl.value._M_string_length);
      literal(&local_a8,0);
      z80::z80(&local_1220,ld,(Operand *)local_708,&local_a8);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.comment._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.comment._M_dataplus._M_p,
                        local_1220.comment.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op2.value._M_dataplus._M_p != paVar3) {
        operator_delete(local_1220.op2.value._M_dataplus._M_p,
                        local_1220.op2.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op1.value._M_dataplus._M_p != paVar1) {
        operator_delete(local_1220.op1.value._M_dataplus._M_p,
                        local_1220.op1.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p !=
          &local_1220.super_ASMLine.text.field_2) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.value._M_dataplus._M_p != &local_a8.value.field_2) {
        operator_delete(local_a8.value._M_dataplus._M_p,
                        local_a8.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_700._M_p != &local_6f0) {
        operator_delete(local_700._M_p,local_6f0._M_allocated_capacity + 1);
      }
      local_730._0_4_ = registers.iy.type;
      local_730._4_4_ = registers.iy.reg_num;
      local_728._M_p = (pointer)&local_718;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_728,registers.iy.value._M_dataplus._M_p,
                 registers.iy.value._M_dataplus._M_p + registers.iy.value._M_string_length);
      paVar2 = &local_3f8.value.field_2;
      local_3f8.type = empty;
      local_3f8.reg_num = 0;
      local_3f8.value._M_string_length = 0;
      local_3f8.value.field_2._8_8_ = 0;
      local_3f8.value.field_2._M_allocated_capacity = 0;
      local_3f8.value._M_dataplus._M_p = (pointer)paVar2;
      z80::z80(&local_1220,push,(Operand *)local_730,&local_3f8);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.comment._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.comment._M_dataplus._M_p,
                        local_1220.comment.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op2.value._M_dataplus._M_p != paVar3) {
        operator_delete(local_1220.op2.value._M_dataplus._M_p,
                        local_1220.op2.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op1.value._M_dataplus._M_p != paVar1) {
        operator_delete(local_1220.op1.value._M_dataplus._M_p,
                        local_1220.op1.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p !=
          &local_1220.super_ASMLine.text.field_2) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8.value._M_dataplus._M_p != paVar2) {
        operator_delete(local_3f8.value._M_dataplus._M_p,
                        local_3f8.value.field_2._M_allocated_capacity + 1);
      }
      local_808._M_allocated_capacity = local_718._M_allocated_capacity;
      _Var10._M_p = local_728._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_728._M_p != &local_718) goto LAB_0011993d;
    }
    else {
      local_758._0_4_ = o1->type;
      local_758._4_4_ = o1->reg_num;
      pcVar4 = (o1->value)._M_dataplus._M_p;
      local_750._M_p = (pointer)&local_740;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_750,pcVar4,pcVar4 + (o1->value)._M_string_length);
      translateValue((Operand *)&local_1220,(Operand *)local_758);
      bVar5 = Operand::operator==((Operand *)&local_1220,&registers.de);
      bVar6 = true;
      if (!bVar5) {
        local_10c8._0_4_ = o1->type;
        local_10c8._4_4_ = o1->reg_num;
        local_10c0._M_p = (pointer)&local_10b0;
        pcVar4 = (o1->value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_10c0,pcVar4,pcVar4 + (o1->value)._M_string_length);
        translateValue((Operand *)local_1180,(Operand *)local_10c8);
        bVar5 = Operand::operator==((Operand *)local_1180,&registers.bc);
        bVar6 = true;
        if (!bVar5) {
          local_780._0_4_ = o1->type;
          local_780._4_4_ = o1->reg_num;
          pcVar4 = (o1->value)._M_dataplus._M_p;
          local_778._M_p = (pointer)&local_768;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_778,pcVar4,pcVar4 + (o1->value)._M_string_length);
          translateValue(&local_1118,(Operand *)local_780);
          bVar6 = Operand::operator==(&local_1118,&registers.hl);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1118.value._M_dataplus._M_p != &local_1118.value.field_2) {
            operator_delete(local_1118.value._M_dataplus._M_p,
                            local_1118.value.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_778._M_p != &local_768) {
            operator_delete(local_778._M_p,local_768._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1180._8_8_ != &local_1168) {
          operator_delete((void *)local_1180._8_8_,
                          CONCAT71(local_1168._M_allocated_capacity._1_7_,local_1168._M_local_buf[0]
                                  ) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_10c0._M_p != &local_10b0) {
          operator_delete(local_10c0._M_p,local_10b0._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p !=
          &local_1220.super_ASMLine.text.field_2) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_750._M_p != &local_740) {
        operator_delete(local_750._M_p,local_740._M_allocated_capacity + 1);
      }
      if (bVar6 == false) {
        local_7d0._0_4_ = registers.iy.type;
        local_7d0._4_4_ = registers.iy.reg_num;
        local_7c8._M_p = (pointer)&local_7b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7c8,registers.iy.value._M_dataplus._M_p,
                   registers.iy.value._M_dataplus._M_p + registers.iy.value._M_string_length);
        local_7f8._0_4_ = o1->type;
        local_7f8._4_4_ = o1->reg_num;
        pcVar4 = (o1->value)._M_dataplus._M_p;
        local_7f0._M_p = (pointer)&local_7e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7f0,pcVar4,pcVar4 + (o1->value)._M_string_length);
        translateValue(&local_f8,(Operand *)local_7f8);
        z80::z80(&local_1220,ld,(Operand *)local_7d0,&local_f8);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
        z80::~z80(&local_1220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.value._M_dataplus._M_p != &local_f8.value.field_2) {
          operator_delete(local_f8.value._M_dataplus._M_p,
                          local_f8.value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f0._M_p != &local_7e0) {
          operator_delete(local_7f0._M_p,local_7e0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_p != &local_7b8) {
          operator_delete(local_7c8._M_p,local_7b8._M_allocated_capacity + 1);
        }
        local_820._0_4_ = registers.iy.type;
        local_820._4_4_ = registers.iy.reg_num;
        local_818._M_p = (pointer)&local_808;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_818,registers.iy.value._M_dataplus._M_p,
                   registers.iy.value._M_dataplus._M_p + registers.iy.value._M_string_length);
        paVar9 = &local_458.value.field_2;
        local_458.type = empty;
        local_458.reg_num = 0;
        local_458.value._M_string_length = 0;
        local_458.value.field_2._8_8_ = 0;
        local_458.value.field_2._M_allocated_capacity = 0;
        local_458.value._M_dataplus._M_p = (pointer)paVar9;
        z80::z80(&local_1220,push,(Operand *)local_820,&local_458);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
        z80::~z80(&local_1220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458.value._M_dataplus._M_p != paVar9) {
          operator_delete(local_458.value._M_dataplus._M_p,
                          local_458.value.field_2._M_allocated_capacity + 1);
        }
        _Var10._M_p = local_818._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_818._M_p != &local_808) goto LAB_0011993d;
      }
      else {
        local_7a8._0_4_ = o1->type;
        local_7a8._4_4_ = o1->reg_num;
        pcVar4 = (o1->value)._M_dataplus._M_p;
        local_7a0._M_p = (pointer)&local_790;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7a0,pcVar4,pcVar4 + (o1->value)._M_string_length);
        translateValue(&local_d0,(Operand *)local_7a8);
        paVar9 = &local_428.value.field_2;
        local_428.type = empty;
        local_428.reg_num = 0;
        local_428.value._M_string_length = 0;
        local_428.value.field_2._8_8_ = 0;
        local_428.value.field_2._M_allocated_capacity = 0;
        local_428.value._M_dataplus._M_p = (pointer)paVar9;
        z80::z80(&local_1220,push,&local_d0,&local_428);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
        z80::~z80(&local_1220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428.value._M_dataplus._M_p != paVar9) {
          operator_delete(local_428.value._M_dataplus._M_p,
                          local_428.value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.value._M_dataplus._M_p != &local_d0.value.field_2) {
          operator_delete(local_d0.value._M_dataplus._M_p,
                          local_d0.value.field_2._M_allocated_capacity + 1);
        }
        local_808._M_allocated_capacity = local_790._M_allocated_capacity;
        _Var10._M_p = local_7a0._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a0._M_p != &local_790) {
LAB_0011993d:
          operator_delete(_Var10._M_p,local_808._M_allocated_capacity + 1);
        }
      }
    }
    local_848._0_4_ = registers.sp.type;
    local_848._4_4_ = registers.sp.reg_num;
    local_840._M_p = (pointer)&local_830;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_840,registers.sp.value._M_dataplus._M_p,
               registers.sp.value._M_dataplus._M_p + registers.sp.value._M_string_length);
    paVar9 = &local_488.value.field_2;
    local_488.type = empty;
    local_488.reg_num = 0;
    local_488.value._M_string_length = 0;
    local_488.value.field_2._8_8_ = 0;
    local_488.value.field_2._M_allocated_capacity = 0;
    local_488.value._M_dataplus._M_p = (pointer)paVar9;
    z80::z80(&local_1220,inc,(Operand *)local_848,&local_488);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
    paVar3 = &local_1220.comment.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.comment._M_dataplus._M_p != paVar3) {
      operator_delete(local_1220.comment._M_dataplus._M_p,
                      local_1220.comment.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_1220.op2.value.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op2.value._M_dataplus._M_p != paVar1) {
      operator_delete(local_1220.op2.value._M_dataplus._M_p,
                      local_1220.op2.value.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_1220.op1.value.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op1.value._M_dataplus._M_p != paVar2) {
      operator_delete(local_1220.op1.value._M_dataplus._M_p,
                      local_1220.op1.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != &local_1220.super_ASMLine.text.field_2)
    {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488.value._M_dataplus._M_p != paVar9) {
      operator_delete(local_488.value._M_dataplus._M_p,
                      local_488.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840._M_p != &local_830) {
      operator_delete(local_840._M_p,local_830._M_allocated_capacity + 1);
    }
    local_870._0_4_ = registers.ix.type;
    local_870._4_4_ = registers.ix.reg_num;
    local_868._M_p = (pointer)&local_858;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_868,registers.ix.value._M_dataplus._M_p,
               registers.ix.value._M_dataplus._M_p + registers.ix.value._M_string_length);
    paVar9 = &local_4b8.value.field_2;
    local_4b8.type = empty;
    local_4b8.reg_num = 0;
    local_4b8.value._M_string_length = 0;
    local_4b8.value.field_2._8_8_ = 0;
    local_4b8.value.field_2._M_allocated_capacity = 0;
    local_4b8.value._M_dataplus._M_p = (pointer)paVar9;
    z80::z80(&local_1220,dec,(Operand *)local_870,&local_4b8);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.comment._M_dataplus._M_p != paVar3) {
      operator_delete(local_1220.comment._M_dataplus._M_p,
                      local_1220.comment.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op2.value._M_dataplus._M_p != paVar1) {
      operator_delete(local_1220.op2.value._M_dataplus._M_p,
                      local_1220.op2.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op1.value._M_dataplus._M_p != paVar2) {
      operator_delete(local_1220.op1.value._M_dataplus._M_p,
                      local_1220.op1.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != &local_1220.super_ASMLine.text.field_2)
    {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8.value._M_dataplus._M_p != paVar9) {
      operator_delete(local_4b8.value._M_dataplus._M_p,
                      local_4b8.value.field_2._M_allocated_capacity + 1);
    }
    local_fd8._M_allocated_capacity = local_858._M_allocated_capacity;
    local_58.value._M_dataplus._M_p = local_868._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_868._M_p == &local_858) {
      return;
    }
    break;
  case popl:
    local_898 = (undefined1  [8])registers.sp._0_8_;
    local_890._M_p = (pointer)&local_880;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_890,registers.sp.value._M_dataplus._M_p,
               registers.sp.value._M_dataplus._M_p + registers.sp.value._M_string_length);
    paVar9 = &local_4e8.value.field_2;
    local_4e8.type = empty;
    local_4e8.reg_num = 0;
    local_4e8.value._M_string_length = 0;
    local_4e8.value.field_2._8_8_ = 0;
    local_4e8.value.field_2._M_allocated_capacity = 0;
    local_4e8.value._M_dataplus._M_p = (pointer)paVar9;
    z80::z80(&local_1220,dec,(Operand *)local_898,&local_4e8);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
      operator_delete(local_1220.comment._M_dataplus._M_p,
                      local_1220.comment.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_1220.op2.value.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op2.value._M_dataplus._M_p != paVar3) {
      operator_delete(local_1220.op2.value._M_dataplus._M_p,
                      local_1220.op2.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op1.value._M_dataplus._M_p != &local_1220.op1.value.field_2) {
      operator_delete(local_1220.op1.value._M_dataplus._M_p,
                      local_1220.op1.value.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_1220.super_ASMLine.text.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar1) {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8.value._M_dataplus._M_p != paVar9) {
      operator_delete(local_4e8.value._M_dataplus._M_p,
                      local_4e8.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_890._M_p != &local_880) {
      operator_delete(local_890._M_p,local_880._M_allocated_capacity + 1);
    }
    local_8c0._0_4_ = registers.ix.type;
    local_8c0._4_4_ = registers.ix.reg_num;
    local_8b8._M_p = (pointer)&local_8a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8b8,registers.ix.value._M_dataplus._M_p,
               registers.ix.value._M_dataplus._M_p + registers.ix.value._M_string_length);
    paVar9 = &local_518.value.field_2;
    local_518.type = empty;
    local_518.reg_num = 0;
    local_518.value._M_string_length = 0;
    local_518.value.field_2._8_8_ = 0;
    local_518.value.field_2._M_allocated_capacity = 0;
    local_518.value._M_dataplus._M_p = (pointer)paVar9;
    z80::z80(&local_1220,inc,(Operand *)local_8c0,&local_518);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
      operator_delete(local_1220.comment._M_dataplus._M_p,
                      local_1220.comment.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op2.value._M_dataplus._M_p != paVar3) {
      operator_delete(local_1220.op2.value._M_dataplus._M_p,
                      local_1220.op2.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op1.value._M_dataplus._M_p != &local_1220.op1.value.field_2) {
      operator_delete(local_1220.op1.value._M_dataplus._M_p,
                      local_1220.op1.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar1) {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518.value._M_dataplus._M_p != paVar9) {
      operator_delete(local_518.value._M_dataplus._M_p,
                      local_518.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8b8._M_p != &local_8a8) {
      operator_delete(local_8b8._M_p,local_8a8._M_allocated_capacity + 1);
    }
    local_8e8._0_4_ = o1->type;
    local_8e8._4_4_ = o1->reg_num;
    pcVar4 = (o1->value)._M_dataplus._M_p;
    local_8e0._M_p = (pointer)&local_8d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8e0,pcVar4,pcVar4 + (o1->value)._M_string_length);
    translateValue((Operand *)&local_1220,(Operand *)local_8e8);
    bVar5 = Operand::operator==((Operand *)&local_1220,&registers.a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != &local_1220.super_ASMLine.text.field_2)
    {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e0._M_p != &local_8d0) {
      operator_delete(local_8e0._M_p,local_8d0._M_allocated_capacity + 1);
    }
    paVar9 = &local_1220.super_ASMLine.text.field_2;
    if (bVar5) {
      local_910._0_4_ = registers.iy.type;
      local_910._4_4_ = registers.iy.reg_num;
      local_908._M_p = (pointer)&local_8f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_908,registers.iy.value._M_dataplus._M_p,
                 registers.iy.value._M_dataplus._M_p + registers.iy.value._M_string_length);
      paVar1 = &local_548.value.field_2;
      local_548.type = empty;
      local_548.reg_num = 0;
      local_548.value._M_string_length = 0;
      local_548.value.field_2._8_8_ = 0;
      local_548.value.field_2._M_allocated_capacity = 0;
      local_548.value._M_dataplus._M_p = (pointer)paVar1;
      z80::z80(&local_1220,pop,(Operand *)local_910,&local_548);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
        operator_delete(local_1220.comment._M_dataplus._M_p,
                        local_1220.comment.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op2.value._M_dataplus._M_p != paVar3) {
        operator_delete(local_1220.op2.value._M_dataplus._M_p,
                        local_1220.op2.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op1.value._M_dataplus._M_p != &local_1220.op1.value.field_2) {
        operator_delete(local_1220.op1.value._M_dataplus._M_p,
                        local_1220.op1.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548.value._M_dataplus._M_p != paVar1) {
        operator_delete(local_548.value._M_dataplus._M_p,
                        local_548.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_p != &local_8f8) {
        operator_delete(local_908._M_p,local_8f8._M_allocated_capacity + 1);
      }
      local_938._0_4_ = registers.a.type;
      local_938._4_4_ = registers.a.reg_num;
      local_930._M_p = (pointer)&local_920;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_930,registers.a.value._M_dataplus._M_p,
                 registers.a.value._M_dataplus._M_p + registers.a.value._M_string_length);
      local_960._0_4_ = registers.iyh.type;
      local_960._4_4_ = registers.iyh.reg_num;
      local_958._M_p = (pointer)&local_948;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_958,registers.iyh.value._M_dataplus._M_p,
                 registers.iyh.value._M_dataplus._M_p + registers.iyh.value._M_string_length);
      z80::z80(&local_1220,ld,(Operand *)local_938,(Operand *)local_960);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
        operator_delete(local_1220.comment._M_dataplus._M_p,
                        local_1220.comment.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op2.value._M_dataplus._M_p != paVar3) {
        operator_delete(local_1220.op2.value._M_dataplus._M_p,
                        local_1220.op2.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.op1.value._M_dataplus._M_p != &local_1220.op1.value.field_2) {
        operator_delete(local_1220.op1.value._M_dataplus._M_p,
                        local_1220.op1.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p != paVar9) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_958._M_p != &local_948) {
        operator_delete(local_958._M_p,local_948._M_allocated_capacity + 1);
      }
      local_fd8._M_allocated_capacity = local_920._M_allocated_capacity;
      local_58.value._M_dataplus._M_p = local_930._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_930._M_p == &local_920) {
        return;
      }
    }
    else {
      local_10f0._0_4_ = o1->type;
      local_10f0._4_4_ = o1->reg_num;
      local_10e8._M_p = (pointer)&local_10d8;
      pcVar4 = (o1->value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_10e8,pcVar4,pcVar4 + (o1->value)._M_string_length);
      translateValue((Operand *)&local_1220,(Operand *)local_10f0);
      bVar5 = Operand::operator==((Operand *)&local_1220,&registers.de);
      bVar6 = true;
      if (!bVar5) {
        local_988._0_4_ = o1->type;
        local_988._4_4_ = o1->reg_num;
        pcVar4 = (o1->value)._M_dataplus._M_p;
        local_980._M_p = (pointer)&local_970;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_980,pcVar4,pcVar4 + (o1->value)._M_string_length);
        translateValue((Operand *)local_1180,(Operand *)local_988);
        bVar5 = Operand::operator==((Operand *)local_1180,&registers.bc);
        bVar6 = true;
        if (!bVar5) {
          local_9b0._0_4_ = o1->type;
          local_9b0._4_4_ = o1->reg_num;
          pcVar4 = (o1->value)._M_dataplus._M_p;
          local_9a8._M_p = (pointer)&local_998;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_9a8,pcVar4,pcVar4 + (o1->value)._M_string_length);
          translateValue(&local_1118,(Operand *)local_9b0);
          bVar6 = Operand::operator==(&local_1118,&registers.hl);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1118.value._M_dataplus._M_p != &local_1118.value.field_2) {
            operator_delete(local_1118.value._M_dataplus._M_p,
                            local_1118.value.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9a8._M_p != &local_998) {
            operator_delete(local_9a8._M_p,local_998._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1180._8_8_ != &local_1168) {
          operator_delete((void *)local_1180._8_8_,
                          CONCAT71(local_1168._M_allocated_capacity._1_7_,local_1168._M_local_buf[0]
                                  ) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_980._M_p != &local_970) {
          operator_delete(local_980._M_p,local_970._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.super_ASMLine.text._M_dataplus._M_p !=
          &local_1220.super_ASMLine.text.field_2) {
        operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                        CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                                 local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10e8._M_p != &local_10d8) {
        operator_delete(local_10e8._M_p,local_10d8._M_allocated_capacity + 1);
      }
      if (bVar6 == false) {
        local_a00._0_4_ = registers.iy.type;
        local_a00._4_4_ = registers.iy.reg_num;
        local_9f8._M_p = (pointer)&local_9e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_9f8,registers.iy.value._M_dataplus._M_p,
                   registers.iy.value._M_dataplus._M_p + registers.iy.value._M_string_length);
        paVar9 = &local_5a8.value.field_2;
        local_5a8.type = empty;
        local_5a8.reg_num = 0;
        local_5a8.value._M_string_length = 0;
        local_5a8.value.field_2._8_8_ = 0;
        local_5a8.value.field_2._M_allocated_capacity = 0;
        local_5a8.value._M_dataplus._M_p = (pointer)paVar9;
        z80::z80(&local_1220,pop,(Operand *)local_a00,&local_5a8);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
        z80::~z80(&local_1220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8.value._M_dataplus._M_p != paVar9) {
          operator_delete(local_5a8.value._M_dataplus._M_p,
                          local_5a8.value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9f8._M_p != &local_9e8) {
          operator_delete(local_9f8._M_p,local_9e8._M_allocated_capacity + 1);
        }
        local_a28._0_4_ = o1->type;
        local_a28._4_4_ = o1->reg_num;
        pcVar4 = (o1->value)._M_dataplus._M_p;
        local_a20._M_p = (pointer)&local_a10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a20,pcVar4,pcVar4 + (o1->value)._M_string_length);
        translateValue(&local_148,(Operand *)local_a28);
        local_a50._0_4_ = registers.iy.type;
        local_a50._4_4_ = registers.iy.reg_num;
        local_a48._M_p = (pointer)&local_a38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a48,registers.iy.value._M_dataplus._M_p,
                   registers.iy.value._M_dataplus._M_p + registers.iy.value._M_string_length);
        z80::z80(&local_1220,ld,&local_148,(Operand *)local_a50);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
        z80::~z80(&local_1220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a48._M_p != &local_a38) {
          operator_delete(local_a48._M_p,local_a38._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148.value._M_dataplus._M_p != &local_148.value.field_2) {
          operator_delete(local_148.value._M_dataplus._M_p,
                          local_148.value.field_2._M_allocated_capacity + 1);
        }
        local_fd8._M_allocated_capacity = local_a10._M_allocated_capacity;
        local_58.value._M_dataplus._M_p = local_a20._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a20._M_p == &local_a10) {
          return;
        }
      }
      else {
        local_9d8._0_4_ = o1->type;
        local_9d8._4_4_ = o1->reg_num;
        pcVar4 = (o1->value)._M_dataplus._M_p;
        local_9d0._M_p = (pointer)&local_9c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_9d0,pcVar4,pcVar4 + (o1->value)._M_string_length);
        translateValue(&local_120,(Operand *)local_9d8);
        paVar9 = &local_578.value.field_2;
        local_578.type = empty;
        local_578.reg_num = 0;
        local_578.value._M_string_length = 0;
        local_578.value.field_2._8_8_ = 0;
        local_578.value.field_2._M_allocated_capacity = 0;
        local_578.value._M_dataplus._M_p = (pointer)paVar9;
        z80::z80(&local_1220,pop,&local_120,&local_578);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
        z80::~z80(&local_1220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578.value._M_dataplus._M_p != paVar9) {
          operator_delete(local_578.value._M_dataplus._M_p,
                          local_578.value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120.value._M_dataplus._M_p != &local_120.value.field_2) {
          operator_delete(local_120.value._M_dataplus._M_p,
                          local_120.value.field_2._M_allocated_capacity + 1);
        }
        local_fd8._M_allocated_capacity = local_9c0._M_allocated_capacity;
        local_58.value._M_dataplus._M_p = local_9d0._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_p == &local_9c0) {
          return;
        }
      }
    }
    break;
  case calll:
  case callw:
    local_ff0._0_4_ = o1->type;
    local_ff0._4_4_ = o1->reg_num;
    pcVar4 = (o1->value)._M_dataplus._M_p;
    local_fe8._M_p = (pointer)&local_fd8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_fe8,pcVar4,pcVar4 + (o1->value)._M_string_length);
    local_1018._0_4_ = o2->type;
    local_1018._4_4_ = o2->reg_num;
    pcVar4 = (o2->value)._M_dataplus._M_p;
    local_1010._M_p = (pointer)&local_1000;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1010,pcVar4,pcVar4 + (o2->value)._M_string_length);
    z80::z80(&local_1220,call,(Operand *)local_ff0,(Operand *)local_1018);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.comment._M_dataplus._M_p != &local_1220.comment.field_2) {
      operator_delete(local_1220.comment._M_dataplus._M_p,
                      local_1220.comment.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op2.value._M_dataplus._M_p != &local_1220.op2.value.field_2) {
      operator_delete(local_1220.op2.value._M_dataplus._M_p,
                      local_1220.op2.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.op1.value._M_dataplus._M_p != &local_1220.op1.value.field_2) {
      operator_delete(local_1220.op1.value._M_dataplus._M_p,
                      local_1220.op1.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220.super_ASMLine.text._M_dataplus._M_p != &local_1220.super_ASMLine.text.field_2)
    {
      operator_delete(local_1220.super_ASMLine.text._M_dataplus._M_p,
                      CONCAT71(local_1220.super_ASMLine.text.field_2._M_allocated_capacity._1_7_,
                               local_1220.super_ASMLine.text.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1010._M_p != &local_1000) {
      operator_delete(local_1010._M_p,local_1000._M_allocated_capacity + 1);
    }
    local_58.value._M_dataplus._M_p = local_fe8._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fe8._M_p == &local_fd8) {
      return;
    }
  }
  operator_delete(local_58.value._M_dataplus._M_p,local_fd8._M_allocated_capacity + 1);
  return;
}

Assistant:

void translate_instruction(std::vector<z80>& instructions, const i386::OpCode op, const Operand o1, const Operand o2) {
	switch (op) {
		case i386::OpCode::pushl:
			if (translateValue(o1) == registers.a) {
				instructions.emplace_back(z80(z80::OpCode::ld, registers.iyh, registers.a));
				instructions.emplace_back(z80(z80::OpCode::ld, registers.iyl, literal(0)));
				instructions.emplace_back(z80(z80::OpCode::push, registers.iy, Operand()));
			}
			else if(translateValue(o1) == registers.de || translateValue(o1) == registers.bc || translateValue(o1) == registers.hl) {
				instructions.emplace_back(z80(z80::OpCode::push, translateValue(o1), Operand()));
			}
			else {
				instructions.emplace_back(z80(z80::OpCode::ld, registers.iy, translateValue(o1)));
				instructions.emplace_back(z80(z80::OpCode::push, registers.iy, Operand()));
			}
			instructions.emplace_back(z80(z80::OpCode::inc, registers.sp, Operand()));
			instructions.emplace_back(z80(z80::OpCode::dec, registers.ix, Operand()));
			break;
		case i386::OpCode::popl:
			instructions.emplace_back(z80(z80::OpCode::dec, registers.sp, Operand()));
			instructions.emplace_back(z80(z80::OpCode::inc, registers.ix, Operand()));
			if (translateValue(o1) == registers.a) {
				instructions.emplace_back(z80(z80::OpCode::pop, registers.iy, Operand()));
				instructions.emplace_back(z80(z80::OpCode::ld, registers.a, registers.iyh));
			}
			else if(translateValue(o1) == registers.de || translateValue(o1) == registers.bc || translateValue(o1) == registers.hl) {
				instructions.emplace_back(z80(z80::OpCode::pop, translateValue(o1), Operand()));
			}
			else {
				instructions.emplace_back(z80(z80::OpCode::pop, registers.iy, Operand()));
				instructions.emplace_back(z80(z80::OpCode::ld, translateValue(o1),registers.iy));
			}
			break;
		case i386::OpCode::decl:
			instructions.emplace_back(z80(z80::OpCode::dec, translateValue(o1), Operand()));
			instructions.emplace_back(z80(z80::OpCode::cp, literal(0), Operand()));
			break;
		case i386::OpCode::incl:
			instructions.emplace_back(z80(z80::OpCode::inc, translateValue(o1), Operand()));
			instructions.emplace_back(z80(z80::OpCode::cp, literal(0), Operand()));
			break;
		case i386::OpCode::jne:
			instructions.emplace_back(z80(z80::OpCode::jp, literal("nz"), translateLiteral(o1)));
			break;
		case i386::OpCode::subl:
			if (translateValue(o2) == registers.sp) {
				instructions.emplace_back(z80(z80::OpCode::ld, registers.ix, literal("-" + translateLiteral(o1).value)));
				instructions.emplace_back(z80(z80::OpCode::add, registers.ix, registers.sp));
				instructions.emplace_back(z80(z80::OpCode::ld, registers.sp, registers.ix));
			}
			else {
				instructions.emplace_back(z80(z80::OpCode::sub, translateValue(o2), translateLiteral(o1)));
			}
			break;
		case i386::OpCode::addl:
			if (translateValue(o2) == registers.sp) {
				instructions.emplace_back(z80(z80::OpCode::ld, registers.ix, literal(translateLiteral(o1).value)));
				instructions.emplace_back(z80(z80::OpCode::add, registers.ix, registers.sp));
				instructions.emplace_back(z80(z80::OpCode::ld, registers.sp, registers.ix));
			}
			else {
				instructions.emplace_back(z80(z80::OpCode::add, translateValue(o2), translateLiteral(o1)));
			}
			break;
		case i386::OpCode::xorl:
			if (translateRegister(o2) != registers.a) {
				if (translateRegister(o2) == translateRegister(o1)) {
					// Clear the register
					instructions.emplace_back(z80(z80::OpCode::ld, translateRegister(o1),literal(0)));
				}
				else {
					log(LogLevel::Error, "Attempt to xor a register other than a!" + translateRegister(o2).value);
				}
			}
			else {
				instructions.emplace_back(z80(z80::OpCode::_xor, translateValue(o2), translateValue(o1)));
			}
			break;
		case i386::OpCode::movzwl:
			instructions.emplace_back(z80::OpCode::ld, registers.iy, translateLiteral(o1));
			break;
		case i386::OpCode::movw:
			instructions.emplace_back(z80::OpCode::ld, translateAddress(o2), translateValue(o1));
			break;
		case i386::OpCode::movl:
		case i386::OpCode::movb:
			if (o2 == literal("(%esp)")) {
				instructions.emplace_back(z80::OpCode::ld, registers.iyl, translateValue(o1));
				instructions.emplace_back(z80::OpCode::ld, registers.iyh, literal(0));
				instructions.emplace_back(z80::OpCode::ex, literal("(sp)"), registers.iy);
			}
			else {
				if (o1 != Operand(Operand::Type::reg, 0x10)) {
					instructions.emplace_back(z80(z80::OpCode::ld, registers.a, translateLiteral(o1)));
				}
				if (o2 != Operand(Operand::Type::reg, 0x10)) {
					instructions.emplace_back(z80(z80::OpCode::ld, translateAddress(o2), registers.a));
				}
			}
			break;
		case i386::OpCode::calll:
		case i386::OpCode::callw:
			instructions.emplace_back(z80(z80::OpCode::call, o1, o2));
			break;
		case i386::OpCode::ret:
		case i386::OpCode::retl:
			instructions.emplace_back(z80::OpCode::ret);
			break;
		case i386::OpCode::hlt:
			instructions.emplace_back(z80::OpCode::halt);
			break;
		default:
			instructions.emplace_back(z80::OpCode::unknown);
			break;
	}
}